

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

void tinyexr::DecodePixelData
               (uchar **out_images,int *requested_pixel_types,uchar *data_ptr,size_t data_len,
               int compression_type,int line_order,int width,int height,int x_stride,int y,
               int line_no,int num_lines,size_t pixel_data_size,size_t num_attributes,
               EXRAttribute *attributes,size_t num_channels,EXRChannelInfo *channels,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list)

{
  ushort uVar1;
  int iVar2;
  uchar *puVar3;
  long lVar4;
  pointer puVar5;
  pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  uchar uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  size_type sVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  uchar *puVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  size_t sVar29;
  long lVar30;
  float fVar31;
  uchar *puVar32;
  unsigned_long dstLen;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  allocator_type local_51;
  int *local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  uVar7 = (ulong)(uint)width;
  local_50 = requested_pixel_types;
  if (compression_type == 4) {
    sVar17 = (long)(num_lines * width) * pixel_data_size;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_70,sVar17,(allocator_type *)&local_48);
    if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      DecompressPiz(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,data_ptr,sVar17,(int)num_attributes,
                    (EXRChannelInfo *)attributes,width,num_lines);
      puVar5 = local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar32 = local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < (long)num_attributes) {
        lVar13 = (long)x_stride;
        lVar22 = *(long *)num_channels;
        uVar15 = (long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        lVar21 = (long)width;
        uVar7 = 1;
        if (1 < (int)num_attributes) {
          uVar7 = num_attributes & 0xffffffff;
        }
        uVar26 = (ulong)(uint)num_lines;
        uVar28 = (ulong)(uint)width;
        uVar14 = 0;
        do {
          iVar16 = *(int *)(attributes->type + uVar14 * 0x110);
          if (iVar16 == 0) {
            if (0 < num_lines) {
              lVar9 = *(long *)(lVar22 + uVar14 * 8);
              puVar23 = local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar21 * lVar9;
              uVar8 = 0;
              do {
                if (uVar15 <= (uVar8 * pixel_data_size + lVar9) * lVar21) {
                  std::__throw_out_of_range_fmt
                            (
                            "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            );
                  goto LAB_0012e03a;
                }
                if (0 < width) {
                  uVar20 = line_no + (int)uVar8;
                  uVar19 = ~uVar20 + height;
                  if (line_order == 0) {
                    uVar19 = uVar20;
                  }
                  puVar3 = out_images[uVar14];
                  uVar18 = 0;
                  do {
                    *(undefined4 *)(puVar3 + uVar18 * 4 + (long)(int)(uVar19 * x_stride) * 4) =
                         *(undefined4 *)(puVar23 + uVar18 * 4);
                    uVar18 = uVar18 + 1;
                  } while (uVar28 != uVar18);
                }
                uVar8 = uVar8 + 1;
                puVar23 = puVar23 + pixel_data_size * lVar21;
              } while (uVar8 != uVar26);
            }
          }
          else if (iVar16 == 1) {
            if (0 < num_lines) {
              lVar9 = *(long *)(lVar22 + uVar14 * 8);
              puVar23 = local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar21 * lVar9;
              uVar8 = 0;
              do {
                if (uVar15 <= (uVar8 * pixel_data_size + lVar9) * lVar21) goto LAB_0012e03a;
                if (0 < width) {
                  uVar20 = line_no + (int)uVar8;
                  uVar19 = ~uVar20 + height;
                  if (line_order == 0) {
                    uVar19 = uVar20;
                  }
                  iVar16 = local_50[uVar14];
                  lVar30 = (long)(int)(uVar19 * x_stride);
                  uVar18 = 0;
                  do {
                    uVar1 = *(ushort *)(puVar23 + uVar18 * 2);
                    if (iVar16 == 1) {
                      *(ushort *)(out_images[uVar14] + lVar30 * 2) = uVar1;
                    }
                    else {
                      uVar19 = (uint)uVar1 << 0xd;
                      if ((uVar19 & 0xf800000) == 0xf800000) {
                        fVar31 = (float)(uVar19 | 0x70000000);
                      }
                      else if ((uVar19 & 0xf800000) == 0) {
                        fVar31 = (float)(uVar19 | 0x38800000) + -6.1035156e-05;
                      }
                      else {
                        fVar31 = (float)((uVar19 & 0xfffe000) + 0x38000000);
                      }
                      *(uint *)(out_images[uVar14] + lVar30 * 4) =
                           (int)(short)uVar1 & 0x80000000U | (uint)fVar31;
                    }
                    uVar18 = uVar18 + 1;
                    lVar30 = lVar30 + 1;
                  } while (uVar28 != uVar18);
                }
                uVar8 = uVar8 + 1;
                puVar23 = puVar23 + pixel_data_size * lVar21;
              } while (uVar8 != uVar26);
            }
          }
          else if ((iVar16 == 2) && (0 < num_lines)) {
            lVar9 = *(long *)(lVar22 + uVar14 * 8);
            puVar23 = local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar13 * lVar9;
            uVar8 = 0;
            do {
              if (uVar15 <= (uVar8 * pixel_data_size + lVar9) * lVar13) goto LAB_0012e048;
              if (0 < width) {
                uVar20 = line_no + (int)uVar8;
                uVar19 = ~uVar20 + height;
                if (line_order == 0) {
                  uVar19 = uVar20;
                }
                puVar3 = out_images[uVar14];
                uVar18 = 0;
                do {
                  *(undefined4 *)(puVar3 + uVar18 * 4 + (long)(int)(uVar19 * x_stride) * 4) =
                       *(undefined4 *)(puVar23 + uVar18 * 4);
                  uVar18 = uVar18 + 1;
                } while (uVar28 != uVar18);
              }
              uVar8 = uVar8 + 1;
              puVar23 = puVar23 + pixel_data_size * lVar13;
            } while (uVar8 != uVar26);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar7);
      }
joined_r0x0012d9ae:
      if (puVar32 != (uchar *)0x0) {
        operator_delete(puVar32,(long)puVar5 - (long)puVar32);
      }
      return;
    }
    goto LAB_0012e0aa;
  }
  if ((compression_type & 0xfffffffeU) == 2) {
    lVar13 = (long)width;
    lVar22 = (long)num_lines;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_70,lVar22 * lVar13 * pixel_data_size,(allocator_type *)&local_48);
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish +
         -(long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
    if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      DecompressZip(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,(unsigned_long *)&local_48,data_ptr,
                    data_len);
      puVar5 = local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar32 = local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (num_attributes != 0) {
        lVar21 = *(long *)num_channels;
        uVar7 = (long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        lVar9 = (long)height;
        lVar30 = (long)line_no;
        lVar10 = (long)x_stride;
        lVar27 = pixel_data_size * lVar13;
        sVar29 = 0;
        do {
          iVar16 = *(int *)(attributes->type + sVar29 * 0x110);
          if (iVar16 == 0) {
            if (num_lines != 0) {
              lVar4 = *(long *)(lVar21 + sVar29 * 8);
              puVar23 = local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar13 * lVar4;
              lVar24 = 0;
              do {
                if (uVar7 <= (lVar24 * pixel_data_size + lVar4) * lVar13) goto LAB_0012e056;
                if (width != 0) {
                  uVar15 = ~(lVar24 + lVar30) + lVar9;
                  if (line_order == 0) {
                    uVar15 = lVar24 + lVar30;
                  }
                  puVar3 = out_images[sVar29];
                  lVar25 = 0;
                  do {
                    *(undefined4 *)(puVar3 + lVar25 * 4 + uVar15 * lVar10 * 4) =
                         *(undefined4 *)(puVar23 + lVar25 * 4);
                    lVar25 = lVar25 + 1;
                  } while (lVar13 != lVar25);
                }
                lVar24 = lVar24 + 1;
                puVar23 = puVar23 + lVar27;
              } while (lVar24 != lVar22);
            }
          }
          else if (iVar16 == 1) {
            if (num_lines != 0) {
              lVar4 = *(long *)(lVar21 + sVar29 * 8);
              puVar23 = local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar13 * lVar4;
              lVar24 = 0;
              do {
                if (uVar7 <= (lVar24 * pixel_data_size + lVar4) * lVar13) goto LAB_0012e064;
                if (width != 0) {
                  iVar16 = local_50[sVar29];
                  uVar15 = ~(lVar24 + lVar30) + lVar9;
                  if (line_order == 0) {
                    uVar15 = lVar24 + lVar30;
                  }
                  lVar25 = 0;
                  do {
                    uVar1 = *(ushort *)(puVar23 + lVar25 * 2);
                    if (iVar16 == 1) {
                      *(ushort *)(out_images[sVar29] + lVar25 * 2 + uVar15 * lVar10 * 2) = uVar1;
                    }
                    else {
                      uVar19 = (uint)uVar1 << 0xd;
                      if ((uVar19 & 0xf800000) == 0xf800000) {
                        fVar31 = (float)(uVar19 | 0x70000000);
                      }
                      else if ((uVar19 & 0xf800000) == 0) {
                        fVar31 = (float)(uVar19 | 0x38800000) + -6.1035156e-05;
                      }
                      else {
                        fVar31 = (float)((uVar19 & 0xfffe000) + 0x38000000);
                      }
                      *(uint *)(out_images[sVar29] + lVar25 * 4 + uVar15 * lVar10 * 4) =
                           (int)(short)uVar1 & 0x80000000U | (uint)fVar31;
                    }
                    lVar25 = lVar25 + 1;
                  } while (lVar13 != lVar25);
                }
                lVar24 = lVar24 + 1;
                puVar23 = puVar23 + lVar27;
              } while (lVar24 != lVar22);
            }
          }
          else if ((iVar16 == 2) && (num_lines != 0)) {
            lVar4 = *(long *)(lVar21 + sVar29 * 8);
            puVar23 = local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar13 * lVar4;
            lVar24 = 0;
            do {
              if (uVar7 <= (lVar24 * pixel_data_size + lVar4) * lVar13) goto LAB_0012e072;
              if (width != 0) {
                uVar15 = ~(lVar24 + lVar30) + lVar9;
                if (line_order == 0) {
                  uVar15 = lVar24 + lVar30;
                }
                puVar3 = out_images[sVar29];
                lVar25 = 0;
                do {
                  *(undefined4 *)(puVar3 + lVar25 * 4 + uVar15 * lVar10 * 4) =
                       *(undefined4 *)(puVar23 + lVar25 * 4);
                  lVar25 = lVar25 + 1;
                } while (lVar13 != lVar25);
              }
              lVar24 = lVar24 + 1;
              puVar23 = puVar23 + lVar27;
            } while (lVar24 != lVar22);
          }
          sVar29 = sVar29 + 1;
        } while (sVar29 != num_attributes);
      }
      goto joined_r0x0012d9ae;
    }
    goto LAB_0012e0bc;
  }
  if (compression_type != 1) {
    if (compression_type != 0) {
      return;
    }
    if (num_attributes == 0) {
      return;
    }
    iVar16 = ~y + height;
    if (line_order == 0) {
      iVar16 = y;
    }
    sVar29 = 0;
    lVar22 = (long)(iVar16 * x_stride) * 4;
    puVar32 = data_ptr;
    do {
      iVar2 = *(int *)(attributes->type + sVar29 * 0x110);
      if (iVar2 == 0) {
        if (0 < width) {
          puVar23 = out_images[sVar29];
          uVar15 = 0;
          do {
            *(undefined4 *)(puVar23 + uVar15 * 4 + lVar22) = *(undefined4 *)(data_ptr + uVar15 * 4);
            uVar15 = uVar15 + 1;
          } while (uVar7 != uVar15);
        }
      }
      else if (iVar2 == 2) {
        if (0 < width) {
          puVar23 = out_images[sVar29];
          uVar15 = 0;
          do {
            *(undefined4 *)(puVar23 + uVar15 * 4 + lVar22) = *(undefined4 *)(data_ptr + uVar15 * 4);
            uVar15 = uVar15 + 1;
          } while (uVar7 != uVar15);
        }
      }
      else if (iVar2 == 1) {
        if (requested_pixel_types[sVar29] == 2) {
          if (0 < width) {
            puVar23 = out_images[sVar29];
            uVar15 = 0;
            do {
              uVar19 = (uint)*(ushort *)(puVar32 + uVar15 * 2) << 0xd;
              if ((uVar19 & 0xf800000) == 0xf800000) {
                fVar31 = (float)(uVar19 | 0x70000000);
              }
              else if ((uVar19 & 0xf800000) == 0) {
                fVar31 = (float)(uVar19 | 0x38800000) + -6.1035156e-05;
              }
              else {
                fVar31 = (float)((uVar19 & 0xfffe000) + 0x38000000);
              }
              *(uint *)(puVar23 + uVar15 * 4 + lVar22) =
                   (int)(short)*(ushort *)(puVar32 + uVar15 * 2) & 0x80000000U | (uint)fVar31;
              uVar15 = uVar15 + 1;
            } while (uVar7 != uVar15);
          }
        }
        else if ((requested_pixel_types[sVar29] == 1) && (0 < width)) {
          puVar23 = out_images[sVar29];
          uVar15 = 0;
          do {
            *(undefined2 *)(puVar23 + uVar15 * 2 + (long)(iVar16 * x_stride) * 2) =
                 *(undefined2 *)(puVar32 + uVar15 * 2);
            uVar15 = uVar15 + 1;
          } while (uVar7 != uVar15);
        }
      }
      sVar29 = sVar29 + 1;
      data_ptr = data_ptr + (long)width * 4;
      puVar32 = puVar32 + (long)width * 2;
    } while (sVar29 != num_attributes);
    return;
  }
  lVar13 = (long)width;
  lVar22 = (long)num_lines;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_48,lVar22 * lVar13 * pixel_data_size,(allocator_type *)&local_70);
  puVar6 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar17 = (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (sVar17 == 0) goto LAB_0012e0cc;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_70,sVar17,&local_51);
  uVar7 = sVar17;
  puVar32 = puVar5;
  if (0 < (long)data_len) {
    do {
      iVar16 = (int)(char)*data_ptr;
      if (iVar16 < 0) {
        uVar19 = (int)uVar7 + iVar16;
        if ((int)uVar19 < 0) break;
        uVar20 = ((int)data_len + iVar16) - 1;
        uVar15 = (ulong)(uint)-iVar16;
        memcpy(puVar32,data_ptr + 1,uVar15);
        data_ptr = data_ptr + uVar15 + 1;
      }
      else {
        uVar19 = (int)uVar7 - (iVar16 + 1U);
        if ((int)uVar19 < 0) break;
        uVar20 = (int)data_len - 2;
        uVar15 = (ulong)(iVar16 + 1U);
        memset(puVar32,(uint)data_ptr[1],uVar15);
        data_ptr = data_ptr + 2;
      }
      data_len = (size_t)uVar20;
      uVar7 = (ulong)uVar19;
      puVar32 = puVar32 + uVar15;
    } while (0 < (int)uVar20);
  }
  if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    if (1 < (long)sVar17) {
      uVar12 = *local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar32 = local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
      do {
        uVar12 = uVar12 + *puVar32 + 0x80;
        *puVar32 = uVar12;
        puVar32 = puVar32 + 1;
      } while (puVar32 < local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start + sVar17);
    }
    if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      if (0 < (long)sVar17) {
        lVar21 = 0;
        do {
          puVar32 = puVar5 + lVar21 * 2;
          *puVar32 = local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar21];
          if (puVar6 <= puVar32 + 1) break;
          puVar32[1] = local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar21 + (sVar17 + 1 >> 1)];
          lVar21 = lVar21 + 1;
        } while (puVar32 + 2 < puVar6);
      }
      if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_70.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      puVar5 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar32 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (num_attributes != 0) {
        lVar21 = *(long *)num_channels;
        uVar7 = (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        lVar9 = (long)height;
        lVar30 = (long)line_no;
        lVar10 = (long)x_stride;
        lVar27 = pixel_data_size * lVar13;
        sVar29 = 0;
        do {
          iVar16 = *(int *)(attributes->type + sVar29 * 0x110);
          if (iVar16 == 0) {
            if (num_lines != 0) {
              lVar4 = *(long *)(lVar21 + sVar29 * 8);
              puVar23 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar13 * lVar4;
              lVar24 = 0;
              do {
                if (uVar7 <= (lVar24 * pixel_data_size + lVar4) * lVar13) goto LAB_0012e080;
                if (width != 0) {
                  uVar15 = ~(lVar24 + lVar30) + lVar9;
                  if (line_order == 0) {
                    uVar15 = lVar24 + lVar30;
                  }
                  puVar3 = out_images[sVar29];
                  lVar25 = 0;
                  do {
                    *(undefined4 *)(puVar3 + lVar25 * 4 + uVar15 * lVar10 * 4) =
                         *(undefined4 *)(puVar23 + lVar25 * 4);
                    lVar25 = lVar25 + 1;
                  } while (lVar13 != lVar25);
                }
                lVar24 = lVar24 + 1;
                puVar23 = puVar23 + lVar27;
              } while (lVar24 != lVar22);
            }
          }
          else if (iVar16 == 1) {
            if (num_lines != 0) {
              lVar4 = *(long *)(lVar21 + sVar29 * 8);
              puVar23 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar13 * lVar4;
              lVar24 = 0;
              do {
                if (uVar7 <= (lVar24 * pixel_data_size + lVar4) * lVar13) goto LAB_0012e08e;
                if (width != 0) {
                  iVar16 = local_50[sVar29];
                  uVar15 = ~(lVar24 + lVar30) + lVar9;
                  if (line_order == 0) {
                    uVar15 = lVar24 + lVar30;
                  }
                  lVar25 = 0;
                  do {
                    uVar1 = *(ushort *)(puVar23 + lVar25 * 2);
                    if (iVar16 == 1) {
                      *(ushort *)(out_images[sVar29] + lVar25 * 2 + uVar15 * lVar10 * 2) = uVar1;
                    }
                    else {
                      uVar19 = (uint)uVar1 << 0xd;
                      if ((uVar19 & 0xf800000) == 0xf800000) {
                        fVar31 = (float)(uVar19 | 0x70000000);
                      }
                      else if ((uVar19 & 0xf800000) == 0) {
                        fVar31 = (float)(uVar19 | 0x38800000) + -6.1035156e-05;
                      }
                      else {
                        fVar31 = (float)((uVar19 & 0xfffe000) + 0x38000000);
                      }
                      *(uint *)(out_images[sVar29] + lVar25 * 4 + uVar15 * lVar10 * 4) =
                           (int)(short)uVar1 & 0x80000000U | (uint)fVar31;
                    }
                    lVar25 = lVar25 + 1;
                  } while (lVar13 != lVar25);
                }
                lVar24 = lVar24 + 1;
                puVar23 = puVar23 + lVar27;
              } while (lVar24 != lVar22);
            }
          }
          else if ((iVar16 == 2) && (num_lines != 0)) {
            lVar4 = *(long *)(lVar21 + sVar29 * 8);
            puVar23 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar13 * lVar4;
            lVar24 = 0;
            do {
              if (uVar7 <= (lVar24 * pixel_data_size + lVar4) * lVar13) goto LAB_0012e09c;
              if (width != 0) {
                uVar15 = ~(lVar24 + lVar30) + lVar9;
                if (line_order == 0) {
                  uVar15 = lVar24 + lVar30;
                }
                puVar3 = out_images[sVar29];
                lVar25 = 0;
                do {
                  *(undefined4 *)(puVar3 + lVar25 * 4 + uVar15 * lVar10 * 4) =
                       *(undefined4 *)(puVar23 + lVar25 * 4);
                  lVar25 = lVar25 + 1;
                } while (lVar13 != lVar25);
              }
              lVar24 = lVar24 + 1;
              puVar23 = puVar23 + lVar27;
            } while (lVar24 != lVar22);
          }
          sVar29 = sVar29 + 1;
        } while (sVar29 != num_attributes);
      }
      goto joined_r0x0012d9ae;
    }
    goto LAB_0012e0f1;
  }
  goto LAB_0012e0df;
LAB_0012e03a:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0012e048:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0012e056:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0012e064:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0012e072:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0012e080:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0012e08e:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0012e09c:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0012e0aa:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0012e0bc:
  sVar17 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0)
  ;
LAB_0012e0cc:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,sVar17);
LAB_0012e0df:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0012e0f1:
  uVar11 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                      0);
  if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar11);
}

Assistant:

static void DecodePixelData(/* out */ unsigned char **out_images,
                            const int *requested_pixel_types,
                            const unsigned char *data_ptr, size_t data_len,
                            int compression_type, int line_order, int width,
                            int height, int x_stride, int y, int line_no,
                            int num_lines, size_t pixel_data_size,
                            size_t num_attributes,
                            const EXRAttribute *attributes, size_t num_channels,
                            const EXRChannelInfo *channels,
                            const std::vector<size_t> &channel_offset_list) {
  if (compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {  // PIZ
#if TINYEXR_USE_PIZ
    // Allocate original data size.
    std::vector<unsigned char> outBuf(
        static_cast<size_t>(width * num_lines * pixel_data_size));
    size_t tmpBufLen = static_cast<size_t>(width * num_lines * pixel_data_size);

    bool ret = tinyexr::DecompressPiz(
        reinterpret_cast<unsigned char *>(&outBuf.at(0)), data_ptr, tmpBufLen,
        num_channels, channels, width, num_lines);

    assert(ret);

    // For PIZ_COMPRESSION:
    //   pixel sample data for channel 0 for scanline 0
    //   pixel sample data for channel 1 for scanline 0
    //   pixel sample data for channel ... for scanline 0
    //   pixel sample data for channel n for scanline 0
    //   pixel sample data for channel 0 for scanline 1
    //   pixel sample data for channel 1 for scanline 1
    //   pixel sample data for channel ... for scanline 1
    //   pixel sample data for channel n for scanline 1
    //   ...
    for (int c = 0; c < static_cast<int>(num_channels); c++) {
      if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int v = 0; v < num_lines; v++) {
          const unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
              &outBuf.at(v * pixel_data_size * width +
                         channel_offset_list[c] * width));
          for (int u = 0; u < width; u++) {
            FP16 hf;

            hf.u = line_ptr[u];

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&hf.u));

            if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
              unsigned short *image =
                  reinterpret_cast<unsigned short **>(out_images)[c];
              if (line_order == 0) {
                image += (line_no + v) * x_stride + u;
              } else {
                image += (height - 1 - (line_no + v)) * x_stride + u;
              }
              *image = hf.u;
            } else {  // HALF -> FLOAT
              FP32 f32 = half_to_float(hf);
              float *image = reinterpret_cast<float **>(out_images)[c];
              if (line_order == 0) {
                image += (line_no + v) * x_stride + u;
              } else {
                image += (height - 1 - (line_no + v)) * x_stride + u;
              }
              *image = f32.f;
            }
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_UINT);

        for (int v = 0; v < num_lines; v++) {
          const unsigned int *line_ptr = reinterpret_cast<unsigned int *>(
              &outBuf.at(v * pixel_data_size * width +
                         channel_offset_list[c] * width));
          for (int u = 0; u < width; u++) {
            unsigned int val = line_ptr[u];

            tinyexr::swap4(&val);

            unsigned int *image =
                reinterpret_cast<unsigned int **>(out_images)[c];
            if (line_order == 0) {
              image += (line_no + v) * x_stride + u;
            } else {
              image += (height - 1 - (line_no + v)) * x_stride + u;
            }
            *image = val;
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT);
        for (int v = 0; v < num_lines; v++) {
          const float *line_ptr = reinterpret_cast<float *>(
              &outBuf.at(v * pixel_data_size * x_stride +
                         channel_offset_list[c] * x_stride));
          for (int u = 0; u < width; u++) {
            float val = line_ptr[u];

            tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

            float *image = reinterpret_cast<float **>(out_images)[c];
            if (line_order == 0) {
              image += (line_no + v) * x_stride + u;
            } else {
              image += (height - 1 - (line_no + v)) * x_stride + u;
            }
            *image = val;
          }
        }
      } else {
        assert(0);
      }
    }
#else
    assert(0 && "PIZ is enabled in this build");
#endif

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_ZIPS ||
             compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    // Allocate original data size.
    std::vector<unsigned char> outBuf(static_cast<size_t>(width) *
                                      static_cast<size_t>(num_lines) *
                                      pixel_data_size);

    unsigned long dstLen = outBuf.size();
    assert(dstLen > 0);
    tinyexr::DecompressZip(reinterpret_cast<unsigned char *>(&outBuf.at(0)),
                           &dstLen, data_ptr,
                           static_cast<unsigned long>(data_len));

    // For ZIP_COMPRESSION:
    //   pixel sample data for channel 0 for scanline 0
    //   pixel sample data for channel 1 for scanline 0
    //   pixel sample data for channel ... for scanline 0
    //   pixel sample data for channel n for scanline 0
    //   pixel sample data for channel 0 for scanline 1
    //   pixel sample data for channel 1 for scanline 1
    //   pixel sample data for channel ... for scanline 1
    //   pixel sample data for channel n for scanline 1
    //   ...
    for (size_t c = 0; c < static_cast<size_t>(num_channels); c++) {
      if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
              &outBuf.at(v * static_cast<size_t>(pixel_data_size) *
                             static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            tinyexr::FP16 hf;

            hf.u = line_ptr[u];

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&hf.u));

            if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
              unsigned short *image =
                  reinterpret_cast<unsigned short **>(out_images)[c];
              if (line_order == 0) {
                image += (static_cast<size_t>(line_no) + v) *
                             static_cast<size_t>(x_stride) +
                         u;
              } else {
                image += (static_cast<size_t>(height) - 1U -
                          (static_cast<size_t>(line_no) + v)) *
                             static_cast<size_t>(x_stride) +
                         u;
              }
              *image = hf.u;
            } else {  // HALF -> FLOAT
              tinyexr::FP32 f32 = half_to_float(hf);
              float *image = reinterpret_cast<float **>(out_images)[c];
              if (line_order == 0) {
                image += (static_cast<size_t>(line_no) + v) *
                             static_cast<size_t>(x_stride) +
                         u;
              } else {
                image += (static_cast<size_t>(height) - 1U -
                          (static_cast<size_t>(line_no) + v)) *
                             static_cast<size_t>(x_stride) +
                         u;
              }
              *image = f32.f;
            }
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_UINT);

        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const unsigned int *line_ptr = reinterpret_cast<unsigned int *>(
              &outBuf.at(v * pixel_data_size * static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            unsigned int val = line_ptr[u];

            tinyexr::swap4(&val);

            unsigned int *image =
                reinterpret_cast<unsigned int **>(out_images)[c];
            if (line_order == 0) {
              image += (static_cast<size_t>(line_no) + v) *
                           static_cast<size_t>(x_stride) +
                       u;
            } else {
              image += (static_cast<size_t>(height) - 1U -
                        (static_cast<size_t>(line_no) + v)) *
                           static_cast<size_t>(x_stride) +
                       u;
            }
            *image = val;
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT);
        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const float *line_ptr = reinterpret_cast<float *>(
              &outBuf.at(v * pixel_data_size * static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            float val = line_ptr[u];

            tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

            float *image = reinterpret_cast<float **>(out_images)[c];
            if (line_order == 0) {
              image += (static_cast<size_t>(line_no) + v) *
                           static_cast<size_t>(x_stride) +
                       u;
            } else {
              image += (static_cast<size_t>(height) - 1U -
                        (static_cast<size_t>(line_no) + v)) *
                           static_cast<size_t>(x_stride) +
                       u;
            }
            *image = val;
          }
        }
      } else {
        assert(0);
      }
    }
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_RLE) {
    // Allocate original data size.
    std::vector<unsigned char> outBuf(static_cast<size_t>(width) *
                                      static_cast<size_t>(num_lines) *
                                      pixel_data_size);

    unsigned long dstLen = outBuf.size();
    assert(dstLen > 0);
    tinyexr::DecompressRle(reinterpret_cast<unsigned char *>(&outBuf.at(0)),
                           dstLen, data_ptr,
                           static_cast<unsigned long>(data_len));

    // For ZIP_COMPRESSION:
    //   pixel sample data for channel 0 for scanline 0
    //   pixel sample data for channel 1 for scanline 0
    //   pixel sample data for channel ... for scanline 0
    //   pixel sample data for channel n for scanline 0
    //   pixel sample data for channel 0 for scanline 1
    //   pixel sample data for channel 1 for scanline 1
    //   pixel sample data for channel ... for scanline 1
    //   pixel sample data for channel n for scanline 1
    //   ...
    for (size_t c = 0; c < static_cast<size_t>(num_channels); c++) {
      if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
              &outBuf.at(v * static_cast<size_t>(pixel_data_size) *
                             static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            tinyexr::FP16 hf;

            hf.u = line_ptr[u];

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&hf.u));

            if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
              unsigned short *image =
                  reinterpret_cast<unsigned short **>(out_images)[c];
              if (line_order == 0) {
                image += (static_cast<size_t>(line_no) + v) *
                             static_cast<size_t>(x_stride) +
                         u;
              } else {
                image += (static_cast<size_t>(height) - 1U -
                          (static_cast<size_t>(line_no) + v)) *
                             static_cast<size_t>(x_stride) +
                         u;
              }
              *image = hf.u;
            } else {  // HALF -> FLOAT
              tinyexr::FP32 f32 = half_to_float(hf);
              float *image = reinterpret_cast<float **>(out_images)[c];
              if (line_order == 0) {
                image += (static_cast<size_t>(line_no) + v) *
                             static_cast<size_t>(x_stride) +
                         u;
              } else {
                image += (static_cast<size_t>(height) - 1U -
                          (static_cast<size_t>(line_no) + v)) *
                             static_cast<size_t>(x_stride) +
                         u;
              }
              *image = f32.f;
            }
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_UINT);

        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const unsigned int *line_ptr = reinterpret_cast<unsigned int *>(
              &outBuf.at(v * pixel_data_size * static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            unsigned int val = line_ptr[u];

            tinyexr::swap4(&val);

            unsigned int *image =
                reinterpret_cast<unsigned int **>(out_images)[c];
            if (line_order == 0) {
              image += (static_cast<size_t>(line_no) + v) *
                           static_cast<size_t>(x_stride) +
                       u;
            } else {
              image += (static_cast<size_t>(height) - 1U -
                        (static_cast<size_t>(line_no) + v)) *
                           static_cast<size_t>(x_stride) +
                       u;
            }
            *image = val;
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT);
        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const float *line_ptr = reinterpret_cast<float *>(
              &outBuf.at(v * pixel_data_size * static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            float val = line_ptr[u];

            tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

            float *image = reinterpret_cast<float **>(out_images)[c];
            if (line_order == 0) {
              image += (static_cast<size_t>(line_no) + v) *
                           static_cast<size_t>(x_stride) +
                       u;
            } else {
              image += (static_cast<size_t>(height) - 1U -
                        (static_cast<size_t>(line_no) + v)) *
                           static_cast<size_t>(x_stride) +
                       u;
            }
            *image = val;
          }
        }
      } else {
        assert(0);
      }
    }
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
    tinyexr::ZFPCompressionParam zfp_compression_param;
    if (!FindZFPCompressionParam(&zfp_compression_param, attributes,
                                 num_attributes)) {
      assert(0);
      return;
    }

    // Allocate original data size.
    std::vector<unsigned char> outBuf(static_cast<size_t>(width) *
                                      static_cast<size_t>(num_lines) *
                                      pixel_data_size);

    unsigned long dstLen = outBuf.size();
    assert(dstLen > 0);
    tinyexr::DecompressZfp(reinterpret_cast<float *>(&outBuf.at(0)), width,
                           num_lines, num_channels, data_ptr,
                           static_cast<unsigned long>(data_len),
                           zfp_compression_param);

    // For ZFP_COMPRESSION:
    //   pixel sample data for channel 0 for scanline 0
    //   pixel sample data for channel 1 for scanline 0
    //   pixel sample data for channel ... for scanline 0
    //   pixel sample data for channel n for scanline 0
    //   pixel sample data for channel 0 for scanline 1
    //   pixel sample data for channel 1 for scanline 1
    //   pixel sample data for channel ... for scanline 1
    //   pixel sample data for channel n for scanline 1
    //   ...
    for (size_t c = 0; c < static_cast<size_t>(num_channels); c++) {
      assert(channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT);
      if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT);
        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const float *line_ptr = reinterpret_cast<float *>(
              &outBuf.at(v * pixel_data_size * static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            float val = line_ptr[u];

            tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

            float *image = reinterpret_cast<float **>(out_images)[c];
            if (line_order == 0) {
              image += (static_cast<size_t>(line_no) + v) *
                           static_cast<size_t>(x_stride) +
                       u;
            } else {
              image += (static_cast<size_t>(height) - 1U -
                        (static_cast<size_t>(line_no) + v)) *
                           static_cast<size_t>(x_stride) +
                       u;
            }
            *image = val;
          }
        }
      } else {
        assert(0);
      }
    }
#else
    (void)attributes;
    (void)num_attributes;
    (void)num_channels;
    assert(0);
#endif
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_NONE) {
    for (size_t c = 0; c < num_channels; c++) {
      if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
        const unsigned short *line_ptr =
            reinterpret_cast<const unsigned short *>(
                data_ptr +
                c * static_cast<size_t>(width) * sizeof(unsigned short));

        if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
          unsigned short *outLine =
              reinterpret_cast<unsigned short *>(out_images[c]);
          if (line_order == 0) {
            outLine += y * x_stride;
          } else {
            outLine += (height - 1 - y) * x_stride;
          }

          for (int u = 0; u < width; u++) {
            tinyexr::FP16 hf;

            hf.u = line_ptr[u];

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&hf.u));

            outLine[u] = hf.u;
          }
        } else if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
          float *outLine = reinterpret_cast<float *>(out_images[c]);
          if (line_order == 0) {
            outLine += y * x_stride;
          } else {
            outLine += (height - 1 - y) * x_stride;
          }

          for (int u = 0; u < width; u++) {
            tinyexr::FP16 hf;

            hf.u = line_ptr[u];

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&hf.u));

            tinyexr::FP32 f32 = half_to_float(hf);

            outLine[u] = f32.f;
          }
        } else {
          assert(0);
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        const float *line_ptr = reinterpret_cast<const float *>(
            data_ptr + c * static_cast<size_t>(width) * sizeof(float));

        float *outLine = reinterpret_cast<float *>(out_images[c]);
        if (line_order == 0) {
          outLine += y * x_stride;
        } else {
          outLine += (height - 1 - y) * x_stride;
        }

        for (int u = 0; u < width; u++) {
          float val = line_ptr[u];

          tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

          outLine[u] = val;
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
        const unsigned int *line_ptr = reinterpret_cast<const unsigned int *>(
            data_ptr + c * static_cast<size_t>(width) * sizeof(unsigned int));

        unsigned int *outLine = reinterpret_cast<unsigned int *>(out_images[c]);
        if (line_order == 0) {
          outLine += y * x_stride;
        } else {
          outLine += (height - 1 - y) * x_stride;
        }

        for (int u = 0; u < width; u++) {
          unsigned int val = line_ptr[u];

          tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

          outLine[u] = val;
        }
      }
    }
  }
}